

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O1

void __thiscall ObjLoader::loadImage(ObjLoader *this,string *texture_filename)

{
  pointer pcVar1;
  bool bVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  Image<unsigned_char> image;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  key_type local_40;
  
  pcVar1 = (texture_filename->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + texture_filename->_M_string_length);
  if (texture_filename->_M_string_length != 0) {
    cVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&this->m_images,&local_40);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::operator+(&local_68,&this->m_rootDir,texture_filename);
      loadImage();
      bVar2 = fileExists(texture_filename);
      if (bVar2) {
        local_68._M_dataplus._M_p = (pointer)0x0;
        local_68.field_2._M_allocated_capacity = 0;
        local_68._M_string_length = 1;
        local_68.field_2._M_allocated_capacity =
             (size_type)
             stbi_load((texture_filename->_M_dataplus)._M_p,(int *)&local_68,
                       (int *)((long)&local_68._M_dataplus._M_p + 4),
                       (int *)((long)&local_68._M_string_length + 4),0);
        if ((stbi_uc *)local_68.field_2._M_allocated_capacity != (stbi_uc *)0x0) {
          pmVar4 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&this->m_images,&local_40);
          pmVar4->data = (uchar *)local_68.field_2._M_allocated_capacity;
          *(pointer *)pmVar4 = local_68._M_dataplus._M_p;
          pmVar4->depth = (undefined4)local_68._M_string_length;
          pmVar4->channels = local_68._M_string_length._4_4_;
          goto LAB_0010d685;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unable to load texture: ",0x18);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(texture_filename->_M_dataplus)._M_p,
                            texture_filename->_M_string_length);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unable to find file: ",0x15);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(texture_filename->_M_dataplus)._M_p,
                            texture_filename->_M_string_length);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      exit(1);
    }
  }
LAB_0010d685:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ObjLoader::loadImage(std::string texture_filename)
{
  std::string key = texture_filename;
  if (texture_filename.length() > 0) {
    // Only load the texture if it is not already loaded
    if (not m_images.find(key)) {
      texture_filename = m_rootDir + texture_filename;
      if (!fileExists(texture_filename)) {
        std::cerr << "Unable to find file: " << texture_filename << std::endl;
        exit(1);
      }

      Image<> image;
      image.depth = 1;
      image.data = stbi_load(texture_filename.c_str(), &image.width, &image.height, &image.channels, STBI_default);
      if (!image.data) {
        std::cerr << "Unable to load texture: " << texture_filename << std::endl;
        exit(1);
      }
      m_images.add(key, image);
    }
  }
}